

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssim_sse2.c
# Opt level: O0

double SSIMGet_SSE2(uint8_t *src1,int stride1,uint8_t *src2,int stride2)

{
  ushort uVar1;
  uint7 uVar2;
  uint7 uVar3;
  uint7 uVar4;
  ushort uVar5;
  uint7 uVar6;
  uint7 uVar7;
  uint6 uVar8;
  uint7 uVar9;
  uint7 uVar10;
  uint7 uVar11;
  uint7 uVar12;
  uint7 uVar13;
  uint7 uVar14;
  uint7 uVar15;
  uint7 uVar16;
  uint7 uVar17;
  uint7 uVar18;
  uint7 uVar19;
  uint7 uVar20;
  uint7 uVar21;
  uint7 uVar22;
  uint7 uVar23;
  uint7 uVar24;
  uint7 uVar25;
  uint7 uVar26;
  uint7 uVar27;
  uint7 uVar28;
  uint7 uVar29;
  uint7 uVar30;
  uint7 uVar31;
  uint7 uVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  uint5 uVar75;
  int in_ECX;
  undefined8 *in_RDX;
  int in_ESI;
  undefined8 *in_RDI;
  short sVar76;
  short sVar77;
  short sVar78;
  short sVar79;
  short sVar80;
  short sVar85;
  short sVar86;
  short sVar87;
  short sVar88;
  short sVar89;
  short sVar90;
  int iVar81;
  int iVar82;
  int iVar83;
  short sVar91;
  short sVar92;
  short sVar93;
  short sVar94;
  short sVar95;
  short sVar96;
  short sVar100;
  short sVar101;
  short sVar102;
  short sVar103;
  short sVar104;
  short sVar105;
  int iVar97;
  int iVar98;
  int iVar99;
  double dVar84;
  short sVar106;
  short sVar107;
  short sVar108;
  short sVar109;
  short sVar110;
  short sVar111;
  short sVar115;
  short sVar116;
  short sVar117;
  short sVar118;
  short sVar119;
  short sVar120;
  int iVar112;
  int iVar113;
  int iVar114;
  short sVar121;
  short sVar122;
  short sVar123;
  short sVar124;
  int iVar125;
  int iVar126;
  int iVar127;
  __m128i wb1_6;
  __m128i wa1_6;
  __m128i b1_6;
  __m128i a1_6;
  __m128i b0_6;
  __m128i a0_6;
  __m128i W_6;
  __m128i Wy_6;
  __m128i wb1_5;
  __m128i wa1_5;
  __m128i b1_5;
  __m128i a1_5;
  __m128i b0_5;
  __m128i a0_5;
  __m128i W_5;
  __m128i Wy_5;
  __m128i wb1_4;
  __m128i wa1_4;
  __m128i b1_4;
  __m128i a1_4;
  __m128i b0_4;
  __m128i a0_4;
  __m128i W_4;
  __m128i Wy_4;
  __m128i wb1_3;
  __m128i wa1_3;
  __m128i b1_3;
  __m128i a1_3;
  __m128i b0_3;
  __m128i a0_3;
  __m128i W_3;
  __m128i Wy_3;
  __m128i wb1_2;
  __m128i wa1_2;
  __m128i b1_2;
  __m128i a1_2;
  __m128i b0_2;
  __m128i a0_2;
  __m128i W_2;
  __m128i Wy_2;
  __m128i wb1_1;
  __m128i wa1_1;
  __m128i b1_1;
  __m128i a1_1;
  __m128i b0_1;
  __m128i a0_1;
  __m128i W_1;
  __m128i Wy_1;
  __m128i wb1;
  __m128i wa1;
  __m128i b1;
  __m128i a1;
  __m128i b0;
  __m128i a0;
  __m128i W;
  __m128i Wy;
  __m128i Wx;
  __m128i xym;
  __m128i yym;
  __m128i xxm;
  __m128i ym;
  __m128i xm;
  __m128i zero;
  VP8DistoStats stats;
  undefined8 local_ed8;
  undefined8 uStack_ed0;
  undefined8 local_ec8;
  undefined8 uStack_ec0;
  undefined8 local_eb8;
  undefined8 uStack_eb0;
  undefined8 local_ea8;
  undefined8 uStack_ea0;
  undefined8 local_e98;
  undefined8 uStack_e90;
  undefined8 local_e88;
  undefined8 uStack_e80;
  uint32_t local_e68;
  uint32_t local_e64;
  uint32_t local_e60;
  uint32_t local_e5c;
  uint32_t local_e58;
  long local_e50;
  long local_e40;
  undefined8 local_e38;
  undefined8 uStack_e30;
  uint16_t *local_e20;
  undefined1 local_e18 [16];
  longlong local_e08;
  longlong lStack_e00;
  undefined1 local_df8 [16];
  longlong local_de8;
  longlong lStack_de0;
  undefined1 local_dd8 [16];
  longlong local_dc8;
  longlong lStack_dc0;
  undefined1 local_db8 [16];
  longlong local_da8;
  longlong lStack_da0;
  undefined1 local_d98 [16];
  longlong local_d88;
  longlong lStack_d80;
  undefined1 local_d78 [16];
  longlong local_d68;
  longlong lStack_d60;
  undefined1 local_d58 [16];
  longlong local_d48;
  longlong lStack_d40;
  undefined1 local_d38 [16];
  longlong local_d28;
  longlong lStack_d20;
  undefined1 local_d18 [16];
  longlong local_d08;
  longlong lStack_d00;
  undefined1 local_cf8 [16];
  longlong local_ce8;
  longlong lStack_ce0;
  undefined1 local_cd8 [16];
  longlong local_cc8;
  longlong lStack_cc0;
  undefined1 local_cb8 [16];
  longlong local_ca8;
  longlong lStack_ca0;
  undefined1 local_c98 [16];
  longlong local_c88;
  longlong lStack_c80;
  undefined1 local_c78 [16];
  longlong local_c68;
  longlong lStack_c60;
  undefined1 local_c58 [16];
  longlong local_c48;
  longlong lStack_c40;
  undefined1 local_c38 [16];
  longlong local_c28;
  longlong lStack_c20;
  undefined1 local_c18 [16];
  longlong local_c08;
  longlong lStack_c00;
  undefined1 local_bf8 [16];
  longlong local_be8;
  longlong lStack_be0;
  undefined1 local_bd8 [16];
  undefined8 local_bc8;
  undefined8 uStack_bc0;
  undefined1 local_bb8 [16];
  undefined8 local_ba8;
  undefined8 uStack_ba0;
  undefined1 local_b98 [16];
  undefined8 local_b88;
  undefined8 uStack_b80;
  undefined8 local_b78;
  undefined8 uStack_b70;
  undefined8 local_b68;
  undefined8 uStack_b60;
  undefined8 local_b58;
  undefined8 uStack_b50;
  undefined8 local_b48;
  undefined8 uStack_b40;
  undefined8 local_b38;
  undefined8 uStack_b30;
  undefined8 local_b28;
  undefined8 uStack_b20;
  undefined8 local_b18;
  undefined8 uStack_b10;
  undefined8 local_b08;
  undefined8 uStack_b00;
  undefined8 local_af8;
  undefined8 uStack_af0;
  undefined8 local_ae8;
  undefined8 uStack_ae0;
  undefined8 local_ad8;
  undefined8 uStack_ad0;
  undefined8 local_ac8;
  undefined8 uStack_ac0;
  undefined8 local_ab8;
  undefined8 uStack_ab0;
  undefined8 local_aa8;
  undefined8 uStack_aa0;
  undefined8 local_a98;
  undefined8 uStack_a90;
  undefined8 local_a88;
  undefined8 uStack_a80;
  undefined8 local_a78;
  undefined8 uStack_a70;
  undefined8 local_a68;
  undefined8 uStack_a60;
  undefined8 local_a58;
  undefined8 uStack_a50;
  undefined8 local_a48;
  undefined8 uStack_a40;
  undefined8 local_a38;
  undefined8 uStack_a30;
  undefined8 local_a28;
  undefined8 uStack_a20;
  undefined8 local_a18;
  undefined8 uStack_a10;
  undefined8 local_a08;
  undefined8 uStack_a00;
  undefined8 local_9f8;
  undefined8 uStack_9f0;
  undefined8 local_9e8;
  undefined8 uStack_9e0;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  undefined8 local_9c8;
  undefined8 uStack_9c0;
  undefined8 local_9b8;
  ulong uStack_9b0;
  ulong local_9a8;
  ulong uStack_9a0;
  undefined8 local_998;
  ulong uStack_990;
  ulong local_988;
  ulong uStack_980;
  undefined8 local_978;
  ulong uStack_970;
  ulong local_968;
  ulong uStack_960;
  undefined8 local_958;
  ulong uStack_950;
  ulong local_948;
  ulong uStack_940;
  undefined8 local_938;
  ulong uStack_930;
  ulong local_928;
  ulong uStack_920;
  undefined8 local_918;
  ulong uStack_910;
  ulong local_908;
  ulong uStack_900;
  undefined8 local_8f8;
  ulong uStack_8f0;
  ulong local_8e8;
  ulong uStack_8e0;
  undefined8 local_8d8;
  ulong uStack_8d0;
  ulong local_8c8;
  ulong uStack_8c0;
  undefined8 local_8b8;
  ulong uStack_8b0;
  ulong local_8a8;
  ulong uStack_8a0;
  undefined8 local_898;
  ulong uStack_890;
  ulong local_888;
  ulong uStack_880;
  undefined8 local_878;
  ulong uStack_870;
  ulong local_868;
  ulong uStack_860;
  undefined8 local_858;
  ulong uStack_850;
  ulong local_848;
  ulong uStack_840;
  undefined8 local_838;
  ulong uStack_830;
  ulong local_828;
  ulong uStack_820;
  undefined8 local_818;
  ulong uStack_810;
  ulong local_808;
  ulong uStack_800;
  undefined8 local_7f8;
  ulong uStack_7f0;
  ulong local_7e8;
  ulong uStack_7e0;
  undefined8 local_7d8;
  ulong uStack_7d0;
  ulong local_7c8;
  ulong uStack_7c0;
  undefined8 local_7b8;
  ulong uStack_7b0;
  ulong local_7a8;
  ulong uStack_7a0;
  undefined8 local_798;
  ulong uStack_790;
  ulong local_788;
  ulong uStack_780;
  undefined8 local_778;
  ulong uStack_770;
  ulong local_768;
  ulong uStack_760;
  undefined8 local_758;
  ulong uStack_750;
  ulong local_748;
  ulong uStack_740;
  undefined8 local_738;
  ulong uStack_730;
  ulong local_728;
  ulong uStack_720;
  undefined2 local_716;
  undefined2 local_714;
  undefined2 local_712;
  undefined2 local_710;
  undefined2 local_70e;
  undefined2 local_70c;
  undefined2 local_70a;
  uint16_t local_708 [4];
  uint16_t auStack_700 [4];
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  uint16_t local_6e8 [4];
  uint16_t auStack_6e0 [4];
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  uint16_t local_6b8 [4];
  uint16_t auStack_6b0 [4];
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined8 local_698;
  undefined8 uStack_690;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 local_668;
  undefined8 uStack_660;
  uint16_t local_658 [4];
  uint16_t auStack_650 [4];
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  uint16_t local_5f8 [4];
  uint16_t auStack_5f0 [4];
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  uint16_t local_598 [4];
  uint16_t auStack_590 [4];
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  uint16_t local_538 [4];
  uint16_t auStack_530 [4];
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  uint16_t local_4d8 [4];
  uint16_t auStack_4d0 [4];
  uint16_t local_4c8 [4];
  uint16_t auStack_4c0 [4];
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  uint16_t local_4a8 [4];
  uint16_t auStack_4a0 [4];
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  uint16_t local_478 [4];
  uint16_t auStack_470 [4];
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 *local_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 *local_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 *local_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 *local_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 *local_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 *local_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 *local_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined8 *local_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 *local_350;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 *local_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 *local_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 *local_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2a8;
  ulong uStack_2a0;
  longlong local_298;
  ulong uStack_290;
  undefined8 local_288;
  ulong uStack_280;
  longlong local_278;
  ulong uStack_270;
  undefined8 local_268;
  ulong uStack_260;
  longlong local_258;
  ulong uStack_250;
  undefined8 local_248;
  ulong uStack_240;
  longlong local_238;
  ulong uStack_230;
  undefined8 local_228;
  ulong uStack_220;
  longlong local_218;
  ulong uStack_210;
  undefined8 local_208;
  ulong uStack_200;
  longlong local_1f8;
  ulong uStack_1f0;
  undefined8 local_1e8;
  ulong uStack_1e0;
  longlong local_1d8;
  ulong uStack_1d0;
  undefined8 local_1c8;
  ulong uStack_1c0;
  longlong local_1b8;
  ulong uStack_1b0;
  undefined8 local_1a8;
  ulong uStack_1a0;
  longlong local_198;
  ulong uStack_190;
  undefined8 local_188;
  ulong uStack_180;
  longlong local_178;
  ulong uStack_170;
  undefined8 local_168;
  ulong uStack_160;
  longlong local_158;
  ulong uStack_150;
  undefined8 local_148;
  ulong uStack_140;
  longlong local_138;
  ulong uStack_130;
  undefined8 local_128;
  ulong uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  ulong uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined2 local_d8;
  undefined2 local_d6;
  undefined2 local_d4;
  undefined2 local_d2;
  undefined2 local_d0;
  undefined2 local_ce;
  undefined2 local_cc;
  undefined2 local_ca;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined2 local_b8;
  undefined2 local_b6;
  undefined2 local_b4;
  undefined2 local_b2;
  undefined2 local_b0;
  undefined2 local_ae;
  undefined2 local_ac;
  undefined2 local_aa;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined2 local_98;
  undefined2 local_96;
  undefined2 local_94;
  undefined2 local_92;
  undefined2 local_90;
  undefined2 local_8e;
  undefined2 local_8c;
  undefined2 local_8a;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined2 local_78;
  undefined2 local_76;
  undefined2 local_74;
  undefined2 local_72;
  undefined2 local_70;
  undefined2 local_6e;
  undefined2 local_6c;
  undefined2 local_6a;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined2 local_58;
  undefined2 local_56;
  undefined2 local_54;
  undefined2 local_52;
  undefined2 local_50;
  undefined2 local_4e;
  undefined2 local_4c;
  undefined2 local_4a;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined2 local_38;
  undefined2 local_36;
  undefined2 local_34;
  undefined2 local_32;
  undefined2 local_30;
  undefined2 local_2e;
  undefined2 local_2c;
  undefined2 local_2a;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined2 local_10;
  undefined2 local_e;
  undefined2 local_c;
  undefined2 local_a;
  undefined2 local_8;
  undefined2 local_6;
  undefined2 local_4;
  undefined2 local_2;
  
  local_e38 = 0;
  uStack_e30 = 0;
  local_e88 = 0;
  uStack_e80 = 0;
  local_e20 = kWeight;
  local_708[0] = 1;
  local_708[1] = 2;
  local_708[2] = 3;
  local_708[3] = 4;
  auStack_700[0] = 3;
  auStack_700[1] = 2;
  auStack_700[2] = 1;
  auStack_700[3] = 0;
  local_70a = 1;
  local_ca = 1;
  local_cc = 1;
  local_ce = 1;
  local_d0 = 1;
  local_d2 = 1;
  local_d4 = 1;
  local_d6 = 1;
  local_d8 = 1;
  local_488 = 0x1000100010001;
  uStack_480 = 0x1000100010001;
  local_2c8 = *in_RDI;
  uStack_2c0 = 0;
  local_2e8 = *in_RDX;
  uStack_2e0 = 0;
  uStack_9c0 = 0;
  local_9d8 = 0;
  uStack_9d0 = 0;
  local_9c8._0_1_ = (byte)local_2c8;
  local_9c8._1_1_ = (byte)((ulong)local_2c8 >> 8);
  local_9c8._2_1_ = (byte)((ulong)local_2c8 >> 0x10);
  local_9c8._3_1_ = (byte)((ulong)local_2c8 >> 0x18);
  local_9c8._4_1_ = (byte)((ulong)local_2c8 >> 0x20);
  local_9c8._5_1_ = (byte)((ulong)local_2c8 >> 0x28);
  local_9c8._6_1_ = (byte)((ulong)local_2c8 >> 0x30);
  local_9c8._7_1_ = (undefined1)((ulong)local_2c8 >> 0x38);
  uStack_9e0 = 0;
  local_9f8 = 0;
  uStack_9f0 = 0;
  local_9e8._0_1_ = (byte)local_2e8;
  local_9e8._1_1_ = (byte)((ulong)local_2e8 >> 8);
  local_9e8._2_1_ = (byte)((ulong)local_2e8 >> 0x10);
  local_9e8._3_1_ = (byte)((ulong)local_2e8 >> 0x18);
  local_9e8._4_1_ = (byte)((ulong)local_2e8 >> 0x20);
  local_9e8._5_1_ = (byte)((ulong)local_2e8 >> 0x28);
  local_9e8._6_1_ = (byte)((ulong)local_2e8 >> 0x30);
  local_9e8._7_1_ = (undefined1)((ulong)local_2e8 >> 0x38);
  uVar5 = (ushort)(byte)local_9c8;
  uVar31 = CONCAT16(local_9c8._3_1_,
                    (uint6)CONCAT14(local_9c8._2_1_,(uint)CONCAT12(local_9c8._1_1_,uVar5)));
  uVar32 = CONCAT16(local_9c8._7_1_,
                    (uint6)CONCAT14(local_9c8._6_1_,
                                    (uint)CONCAT12(local_9c8._5_1_,(ushort)local_9c8._4_1_)));
  local_498._2_2_ = (ushort)local_9c8._1_1_;
  local_498._4_2_ = (ushort)local_9c8._2_1_;
  local_498._6_2_ = (ushort)local_9c8._3_1_;
  uStack_490._2_2_ = (ushort)local_9c8._5_1_;
  uStack_490._4_2_ = (ushort)local_9c8._6_1_;
  sVar85 = local_498._2_2_ * 2;
  sVar91 = local_498._4_2_ * 3;
  sVar100 = local_498._6_2_ * 4;
  sVar106 = (ushort)local_9c8._4_1_ * 3;
  sVar115 = uStack_490._2_2_ * 2;
  uVar1 = (ushort)(byte)local_9e8;
  uVar29 = CONCAT16(local_9e8._3_1_,
                    (uint6)CONCAT14(local_9e8._2_1_,(uint)CONCAT12(local_9e8._1_1_,uVar1)));
  uVar30 = CONCAT16(local_9e8._7_1_,
                    (uint6)CONCAT14(local_9e8._6_1_,
                                    (uint)CONCAT12(local_9e8._5_1_,(ushort)local_9e8._4_1_)));
  local_4b8._2_2_ = (ushort)local_9e8._1_1_;
  local_4b8._4_2_ = (ushort)local_9e8._2_1_;
  local_4b8._6_2_ = (ushort)local_9e8._3_1_;
  uStack_4b0._2_2_ = (ushort)local_9e8._5_1_;
  uStack_4b0._4_2_ = (ushort)local_9e8._6_1_;
  sVar86 = local_4b8._2_2_ * 2;
  sVar92 = local_4b8._4_2_ * 3;
  sVar101 = local_4b8._6_2_ * 4;
  sVar107 = (ushort)local_9e8._4_1_ * 3;
  sVar116 = uStack_4b0._2_2_ * 2;
  local_108 = CONCAT26(sVar100,CONCAT24(sVar91,CONCAT22(sVar85,uVar5)));
  uStack_100 = (ulong)CONCAT14(local_9c8._6_1_,CONCAT22(sVar115,sVar106));
  local_f8 = 0;
  uStack_f0 = 0;
  local_e98._0_4_ = CONCAT22(sVar85,uVar5);
  local_e98._0_6_ = CONCAT24(sVar91,(undefined4)local_e98);
  local_e98 = CONCAT26(sVar100,(undefined6)local_e98);
  uStack_e90._0_4_ = CONCAT22(sVar115,sVar106);
  uStack_e90 = (ulong)CONCAT14(local_9c8._6_1_,(undefined4)uStack_e90);
  local_128 = CONCAT26(sVar101,CONCAT24(sVar92,CONCAT22(sVar86,uVar1)));
  uStack_120 = (ulong)CONCAT14(local_9e8._6_1_,CONCAT22(sVar116,sVar107));
  local_118 = 0;
  uStack_110 = 0;
  local_ea8._0_4_ = CONCAT22(sVar86,uVar1);
  local_ea8._0_6_ = CONCAT24(sVar92,(undefined4)local_ea8);
  local_ea8 = CONCAT26(sVar101,(undefined6)local_ea8);
  uStack_ea0._0_4_ = CONCAT22(sVar116,sVar107);
  uStack_ea0 = (ulong)CONCAT14(local_9e8._6_1_,(undefined4)uStack_ea0);
  local_728 = CONCAT17(0,CONCAT16(local_9c8._3_1_,
                                  (uint6)CONCAT14(local_9c8._2_1_,
                                                  (uint)CONCAT12(local_9c8._1_1_,
                                                                 (ushort)(byte)local_9c8))));
  uVar2 = CONCAT16(local_9c8._7_1_,
                   (uint6)CONCAT14(local_9c8._6_1_,
                                   (uint)CONCAT12(local_9c8._5_1_,(ushort)local_9c8._4_1_)));
  uStack_720 = (ulong)uVar2;
  local_738 = CONCAT26(sVar100,CONCAT24(sVar91,CONCAT22(sVar85,uVar5)));
  uVar75 = CONCAT14(local_9c8._6_1_,CONCAT22(sVar115,sVar106));
  uStack_730 = (ulong)uVar75;
  auVar74._8_7_ = uVar2;
  auVar74._0_8_ = local_728;
  auVar74[0xf] = 0;
  auVar73._8_5_ = uVar75;
  auVar73._0_8_ = local_738;
  auVar73._13_3_ = 0;
  local_b98 = pmaddwd(auVar74,auVar73);
  local_b88 = 0;
  uStack_b80 = 0;
  local_eb8 = local_b98._0_8_;
  uStack_eb0 = local_b98._8_8_;
  local_748 = CONCAT17(0,CONCAT16(local_9c8._3_1_,
                                  (uint6)CONCAT14(local_9c8._2_1_,
                                                  (uint)CONCAT12(local_9c8._1_1_,
                                                                 (ushort)(byte)local_9c8))));
  uVar2 = CONCAT16(local_9c8._7_1_,
                   (uint6)CONCAT14(local_9c8._6_1_,
                                   (uint)CONCAT12(local_9c8._5_1_,(ushort)local_9c8._4_1_)));
  uStack_740 = (ulong)uVar2;
  local_758 = CONCAT26(sVar101,CONCAT24(sVar92,CONCAT22(sVar86,uVar1)));
  uVar75 = CONCAT14(local_9e8._6_1_,CONCAT22(sVar116,sVar107));
  uStack_750 = (ulong)uVar75;
  auVar72._8_7_ = uVar2;
  auVar72._0_8_ = local_748;
  auVar72[0xf] = 0;
  auVar71._8_5_ = uVar75;
  auVar71._0_8_ = local_758;
  auVar71._13_3_ = 0;
  local_bb8 = pmaddwd(auVar72,auVar71);
  local_ba8 = 0;
  uStack_ba0 = 0;
  local_ed8 = local_bb8._0_8_;
  uStack_ed0 = local_bb8._8_8_;
  local_768 = CONCAT17(0,CONCAT16(local_9e8._3_1_,
                                  (uint6)CONCAT14(local_9e8._2_1_,
                                                  (uint)CONCAT12(local_9e8._1_1_,
                                                                 (ushort)(byte)local_9e8))));
  uVar2 = CONCAT16(local_9e8._7_1_,
                   (uint6)CONCAT14(local_9e8._6_1_,
                                   (uint)CONCAT12(local_9e8._5_1_,(ushort)local_9e8._4_1_)));
  uStack_760 = (ulong)uVar2;
  local_778 = CONCAT26(sVar101,CONCAT24(sVar92,CONCAT22(sVar86,uVar1)));
  uVar75 = CONCAT14(local_9e8._6_1_,CONCAT22(sVar116,sVar107));
  uStack_770 = (ulong)uVar75;
  auVar70._8_7_ = uVar2;
  auVar70._0_8_ = local_768;
  auVar70[0xf] = 0;
  auVar69._8_5_ = uVar75;
  auVar69._0_8_ = local_778;
  auVar69._13_3_ = 0;
  local_bd8 = pmaddwd(auVar70,auVar69);
  local_bc8 = 0;
  uStack_bc0 = 0;
  local_ec8 = local_bd8._0_8_;
  uStack_ec0 = local_bd8._8_8_;
  local_2f0 = (undefined8 *)((long)in_RDI + (long)in_ESI);
  local_310 = (undefined8 *)((long)in_RDX + (long)in_ECX);
  local_70c = 2;
  local_aa = 2;
  local_ac = 2;
  local_ae = 2;
  local_b0 = 2;
  local_b2 = 2;
  local_b4 = 2;
  local_b6 = 2;
  local_b8 = 2;
  local_4e8 = 0x2000200020002;
  uStack_4e0 = 0x2000200020002;
  local_308 = *local_2f0;
  uStack_300 = 0;
  local_328 = *local_310;
  uStack_320 = 0;
  uStack_a00 = 0;
  local_a18 = 0;
  uStack_a10 = 0;
  local_a08._0_1_ = (byte)local_308;
  local_a08._1_1_ = (byte)((ulong)local_308 >> 8);
  local_a08._2_1_ = (byte)((ulong)local_308 >> 0x10);
  local_a08._3_1_ = (byte)((ulong)local_308 >> 0x18);
  local_a08._4_1_ = (byte)((ulong)local_308 >> 0x20);
  local_a08._5_1_ = (byte)((ulong)local_308 >> 0x28);
  local_a08._6_1_ = (byte)((ulong)local_308 >> 0x30);
  local_a08._7_1_ = (undefined1)((ulong)local_308 >> 0x38);
  uStack_a20 = 0;
  local_a38 = 0;
  uStack_a30 = 0;
  local_a28._0_1_ = (byte)local_328;
  local_a28._1_1_ = (byte)((ulong)local_328 >> 8);
  local_a28._2_1_ = (byte)((ulong)local_328 >> 0x10);
  local_a28._3_1_ = (byte)((ulong)local_328 >> 0x18);
  local_a28._4_1_ = (byte)((ulong)local_328 >> 0x20);
  local_a28._5_1_ = (byte)((ulong)local_328 >> 0x28);
  local_a28._6_1_ = (byte)((ulong)local_328 >> 0x30);
  local_a28._7_1_ = (undefined1)((ulong)local_328 >> 0x38);
  uVar27 = CONCAT16(local_a08._3_1_,
                    (uint6)CONCAT14(local_a08._2_1_,
                                    (uint)CONCAT12(local_a08._1_1_,(ushort)(byte)local_a08)));
  uVar28 = CONCAT16(local_a08._7_1_,
                    (uint6)CONCAT14(local_a08._6_1_,
                                    (uint)CONCAT12(local_a08._5_1_,(ushort)local_a08._4_1_)));
  local_508 = 0x8000600040002;
  uStack_500 = 0x200040006;
  local_4f8._2_2_ = (ushort)local_a08._1_1_;
  local_4f8._4_2_ = (ushort)local_a08._2_1_;
  local_4f8._6_2_ = (ushort)local_a08._3_1_;
  uStack_4f0._2_2_ = (ushort)local_a08._5_1_;
  uStack_4f0._4_2_ = (ushort)local_a08._6_1_;
  sVar76 = (ushort)(byte)local_a08 * 2;
  sVar87 = local_4f8._2_2_ * 4;
  sVar93 = local_4f8._4_2_ * 6;
  sVar102 = local_4f8._6_2_ * 8;
  sVar108 = (ushort)local_a08._4_1_ * 6;
  sVar117 = uStack_4f0._2_2_ * 4;
  sVar121 = uStack_4f0._4_2_ * 2;
  uVar25 = CONCAT16(local_a28._3_1_,
                    (uint6)CONCAT14(local_a28._2_1_,
                                    (uint)CONCAT12(local_a28._1_1_,(ushort)(byte)local_a28)));
  uVar26 = CONCAT16(local_a28._7_1_,
                    (uint6)CONCAT14(local_a28._6_1_,
                                    (uint)CONCAT12(local_a28._5_1_,(ushort)local_a28._4_1_)));
  local_528 = 0x8000600040002;
  uStack_520 = 0x200040006;
  local_518._2_2_ = (ushort)local_a28._1_1_;
  local_518._4_2_ = (ushort)local_a28._2_1_;
  local_518._6_2_ = (ushort)local_a28._3_1_;
  uStack_510._2_2_ = (ushort)local_a28._5_1_;
  uStack_510._4_2_ = (ushort)local_a28._6_1_;
  sVar77 = (ushort)(byte)local_a28 * 2;
  sVar88 = local_518._2_2_ * 4;
  sVar94 = local_518._4_2_ * 6;
  sVar103 = local_518._6_2_ * 8;
  sVar109 = (ushort)local_a28._4_1_ * 6;
  sVar118 = uStack_510._2_2_ * 4;
  sVar122 = uStack_510._4_2_ * 2;
  local_148 = CONCAT26(sVar102,CONCAT24(sVar93,CONCAT22(sVar87,sVar76)));
  uStack_140 = (ulong)CONCAT24(sVar121,CONCAT22(sVar117,sVar108));
  local_138 = local_e98;
  uStack_130 = uStack_e90;
  local_e98._0_4_ = CONCAT22(sVar85 + sVar87,uVar5 + sVar76);
  local_e98._0_6_ = CONCAT24(sVar91 + sVar93,(undefined4)local_e98);
  local_e98 = CONCAT26(sVar100 + sVar102,(undefined6)local_e98);
  uStack_e90._0_4_ = CONCAT22(sVar115 + sVar117,sVar106 + sVar108);
  uStack_e90._0_6_ = CONCAT24(uStack_490._4_2_ + sVar121,(undefined4)uStack_e90);
  uStack_e90 = (ulong)(uint6)uStack_e90;
  local_168 = CONCAT26(sVar103,CONCAT24(sVar94,CONCAT22(sVar88,sVar77)));
  uStack_160 = (ulong)CONCAT24(sVar122,CONCAT22(sVar118,sVar109));
  local_158 = local_ea8;
  uStack_150 = uStack_ea0;
  local_ea8._0_4_ = CONCAT22(sVar86 + sVar88,uVar1 + sVar77);
  local_ea8._0_6_ = CONCAT24(sVar92 + sVar94,(undefined4)local_ea8);
  local_ea8 = CONCAT26(sVar101 + sVar103,(undefined6)local_ea8);
  uStack_ea0._0_4_ = CONCAT22(sVar116 + sVar118,sVar107 + sVar109);
  uStack_ea0._0_6_ = CONCAT24(uStack_4b0._4_2_ + sVar122,(undefined4)uStack_ea0);
  uStack_ea0 = (ulong)(uint6)uStack_ea0;
  local_788 = CONCAT17(0,CONCAT16(local_a08._3_1_,
                                  (uint6)CONCAT14(local_a08._2_1_,
                                                  (uint)CONCAT12(local_a08._1_1_,
                                                                 (ushort)(byte)local_a08))));
  uVar2 = CONCAT16(local_a08._7_1_,
                   (uint6)CONCAT14(local_a08._6_1_,
                                   (uint)CONCAT12(local_a08._5_1_,(ushort)local_a08._4_1_)));
  uStack_780 = (ulong)uVar2;
  local_798 = CONCAT26(sVar102,CONCAT24(sVar93,CONCAT22(sVar87,sVar76)));
  uVar8 = CONCAT24(sVar121,CONCAT22(sVar117,sVar108));
  uStack_790 = (ulong)uVar8;
  auVar68._8_7_ = uVar2;
  auVar68._0_8_ = local_788;
  auVar68[0xf] = 0;
  auVar67._8_6_ = uVar8;
  auVar67._0_8_ = local_798;
  auVar67._14_2_ = 0;
  local_bf8 = pmaddwd(auVar68,auVar67);
  local_be8 = local_eb8;
  lStack_be0 = uStack_eb0;
  local_eb8 = CONCAT44(local_b98._4_4_ + local_bf8._4_4_,local_b98._0_4_ + local_bf8._0_4_);
  uStack_eb0 = CONCAT44(local_b98._12_4_ + local_bf8._12_4_,local_b98._8_4_ + local_bf8._8_4_);
  local_7a8 = CONCAT17(0,CONCAT16(local_a08._3_1_,
                                  (uint6)CONCAT14(local_a08._2_1_,
                                                  (uint)CONCAT12(local_a08._1_1_,
                                                                 (ushort)(byte)local_a08))));
  uVar2 = CONCAT16(local_a08._7_1_,
                   (uint6)CONCAT14(local_a08._6_1_,
                                   (uint)CONCAT12(local_a08._5_1_,(ushort)local_a08._4_1_)));
  uStack_7a0 = (ulong)uVar2;
  local_7b8 = CONCAT26(sVar103,CONCAT24(sVar94,CONCAT22(sVar88,sVar77)));
  uVar8 = CONCAT24(sVar122,CONCAT22(sVar118,sVar109));
  uStack_7b0 = (ulong)uVar8;
  auVar66._8_7_ = uVar2;
  auVar66._0_8_ = local_7a8;
  auVar66[0xf] = 0;
  auVar65._8_6_ = uVar8;
  auVar65._0_8_ = local_7b8;
  auVar65._14_2_ = 0;
  local_c18 = pmaddwd(auVar66,auVar65);
  local_c08 = local_ed8;
  lStack_c00 = uStack_ed0;
  local_ed8 = CONCAT44(local_bb8._4_4_ + local_c18._4_4_,local_bb8._0_4_ + local_c18._0_4_);
  uStack_ed0 = CONCAT44(local_bb8._12_4_ + local_c18._12_4_,local_bb8._8_4_ + local_c18._8_4_);
  local_7c8 = CONCAT17(0,CONCAT16(local_a28._3_1_,
                                  (uint6)CONCAT14(local_a28._2_1_,
                                                  (uint)CONCAT12(local_a28._1_1_,
                                                                 (ushort)(byte)local_a28))));
  uVar2 = CONCAT16(local_a28._7_1_,
                   (uint6)CONCAT14(local_a28._6_1_,
                                   (uint)CONCAT12(local_a28._5_1_,(ushort)local_a28._4_1_)));
  uStack_7c0 = (ulong)uVar2;
  local_7d8 = CONCAT26(sVar103,CONCAT24(sVar94,CONCAT22(sVar88,sVar77)));
  uVar8 = CONCAT24(sVar122,CONCAT22(sVar118,sVar109));
  uStack_7d0 = (ulong)uVar8;
  auVar64._8_7_ = uVar2;
  auVar64._0_8_ = local_7c8;
  auVar64[0xf] = 0;
  auVar63._8_6_ = uVar8;
  auVar63._0_8_ = local_7d8;
  auVar63._14_2_ = 0;
  local_c38 = pmaddwd(auVar64,auVar63);
  local_c28 = local_ec8;
  lStack_c20 = uStack_ec0;
  local_ec8 = CONCAT44(local_bd8._4_4_ + local_c38._4_4_,local_bd8._0_4_ + local_c38._0_4_);
  uStack_ec0 = CONCAT44(local_bd8._12_4_ + local_c38._12_4_,local_bd8._8_4_ + local_c38._8_4_);
  local_330 = (undefined8 *)((long)local_2f0 + (long)in_ESI);
  local_350 = (undefined8 *)((long)local_310 + (long)in_ECX);
  local_70e = 3;
  local_8a = 3;
  local_8c = 3;
  local_8e = 3;
  local_90 = 3;
  local_92 = 3;
  local_94 = 3;
  local_96 = 3;
  local_98 = 3;
  local_548 = 0x3000300030003;
  uStack_540 = 0x3000300030003;
  local_348 = *local_330;
  uStack_340 = 0;
  local_368 = *local_350;
  uStack_360 = 0;
  uStack_a40 = 0;
  local_a58 = 0;
  uStack_a50 = 0;
  local_a48._0_1_ = (byte)local_348;
  local_a48._1_1_ = (byte)((ulong)local_348 >> 8);
  local_a48._2_1_ = (byte)((ulong)local_348 >> 0x10);
  local_a48._3_1_ = (byte)((ulong)local_348 >> 0x18);
  local_a48._4_1_ = (byte)((ulong)local_348 >> 0x20);
  local_a48._5_1_ = (byte)((ulong)local_348 >> 0x28);
  local_a48._6_1_ = (byte)((ulong)local_348 >> 0x30);
  local_a48._7_1_ = (undefined1)((ulong)local_348 >> 0x38);
  uStack_a60 = 0;
  local_a78 = 0;
  uStack_a70 = 0;
  local_a68._0_1_ = (byte)local_368;
  local_a68._1_1_ = (byte)((ulong)local_368 >> 8);
  local_a68._2_1_ = (byte)((ulong)local_368 >> 0x10);
  local_a68._3_1_ = (byte)((ulong)local_368 >> 0x18);
  local_a68._4_1_ = (byte)((ulong)local_368 >> 0x20);
  local_a68._5_1_ = (byte)((ulong)local_368 >> 0x28);
  local_a68._6_1_ = (byte)((ulong)local_368 >> 0x30);
  local_a68._7_1_ = (undefined1)((ulong)local_368 >> 0x38);
  uVar23 = CONCAT16(local_a48._3_1_,
                    (uint6)CONCAT14(local_a48._2_1_,
                                    (uint)CONCAT12(local_a48._1_1_,(ushort)(byte)local_a48)));
  uVar24 = CONCAT16(local_a48._7_1_,
                    (uint6)CONCAT14(local_a48._6_1_,
                                    (uint)CONCAT12(local_a48._5_1_,(ushort)local_a48._4_1_)));
  local_568 = 0xc000900060003;
  uStack_560 = 0x300060009;
  local_558._2_2_ = (ushort)local_a48._1_1_;
  local_558._4_2_ = (ushort)local_a48._2_1_;
  local_558._6_2_ = (ushort)local_a48._3_1_;
  uStack_550._2_2_ = (ushort)local_a48._5_1_;
  uStack_550._4_2_ = (ushort)local_a48._6_1_;
  sVar78 = (ushort)(byte)local_a48 * 3;
  sVar89 = local_558._2_2_ * 6;
  sVar95 = local_558._4_2_ * 9;
  sVar104 = local_558._6_2_ * 0xc;
  sVar110 = (ushort)local_a48._4_1_ * 9;
  sVar119 = uStack_550._2_2_ * 6;
  sVar123 = uStack_550._4_2_ * 3;
  uVar21 = CONCAT16(local_a68._3_1_,
                    (uint6)CONCAT14(local_a68._2_1_,
                                    (uint)CONCAT12(local_a68._1_1_,(ushort)(byte)local_a68)));
  uVar22 = CONCAT16(local_a68._7_1_,
                    (uint6)CONCAT14(local_a68._6_1_,
                                    (uint)CONCAT12(local_a68._5_1_,(ushort)local_a68._4_1_)));
  local_588 = 0xc000900060003;
  uStack_580 = 0x300060009;
  local_578._2_2_ = (ushort)local_a68._1_1_;
  local_578._4_2_ = (ushort)local_a68._2_1_;
  local_578._6_2_ = (ushort)local_a68._3_1_;
  uStack_570._2_2_ = (ushort)local_a68._5_1_;
  uStack_570._4_2_ = (ushort)local_a68._6_1_;
  sVar79 = (ushort)(byte)local_a68 * 3;
  sVar90 = local_578._2_2_ * 6;
  sVar96 = local_578._4_2_ * 9;
  sVar105 = local_578._6_2_ * 0xc;
  sVar111 = (ushort)local_a68._4_1_ * 9;
  sVar120 = uStack_570._2_2_ * 6;
  sVar124 = uStack_570._4_2_ * 3;
  local_188 = CONCAT26(sVar104,CONCAT24(sVar95,CONCAT22(sVar89,sVar78)));
  uStack_180 = (ulong)CONCAT24(sVar123,CONCAT22(sVar119,sVar110));
  local_178 = local_e98;
  uStack_170 = uStack_e90;
  sVar80 = uVar5 + sVar76 + sVar78;
  sVar87 = sVar85 + sVar87 + sVar89;
  sVar91 = sVar91 + sVar93 + sVar95;
  sVar100 = sVar100 + sVar102 + sVar104;
  sVar102 = sVar106 + sVar108 + sVar110;
  sVar106 = sVar115 + sVar117 + sVar119;
  sVar115 = uStack_490._4_2_ + sVar121 + sVar123;
  local_e98._0_4_ = CONCAT22(sVar87,sVar80);
  local_e98._0_6_ = CONCAT24(sVar91,(undefined4)local_e98);
  local_e98 = CONCAT26(sVar100,(undefined6)local_e98);
  uStack_e90._0_4_ = CONCAT22(sVar106,sVar102);
  uStack_e90._0_6_ = CONCAT24(sVar115,(undefined4)uStack_e90);
  uStack_e90 = (ulong)(uint6)uStack_e90;
  local_1a8 = CONCAT26(sVar105,CONCAT24(sVar96,CONCAT22(sVar90,sVar79)));
  uStack_1a0 = (ulong)CONCAT24(sVar124,CONCAT22(sVar120,sVar111));
  local_198 = local_ea8;
  uStack_190 = uStack_ea0;
  sVar85 = uVar1 + sVar77 + sVar79;
  sVar86 = sVar86 + sVar88 + sVar90;
  sVar92 = sVar92 + sVar94 + sVar96;
  sVar94 = sVar101 + sVar103 + sVar105;
  sVar101 = sVar107 + sVar109 + sVar111;
  sVar107 = sVar116 + sVar118 + sVar120;
  sVar109 = uStack_4b0._4_2_ + sVar122 + sVar124;
  local_ea8._0_4_ = CONCAT22(sVar86,sVar85);
  local_ea8._0_6_ = CONCAT24(sVar92,(undefined4)local_ea8);
  local_ea8 = CONCAT26(sVar94,(undefined6)local_ea8);
  uStack_ea0._0_4_ = CONCAT22(sVar107,sVar101);
  uStack_ea0._0_6_ = CONCAT24(sVar109,(undefined4)uStack_ea0);
  uStack_ea0 = (ulong)(uint6)uStack_ea0;
  local_7e8 = CONCAT17(0,CONCAT16(local_a48._3_1_,
                                  (uint6)CONCAT14(local_a48._2_1_,
                                                  (uint)CONCAT12(local_a48._1_1_,
                                                                 (ushort)(byte)local_a48))));
  uVar2 = CONCAT16(local_a48._7_1_,
                   (uint6)CONCAT14(local_a48._6_1_,
                                   (uint)CONCAT12(local_a48._5_1_,(ushort)local_a48._4_1_)));
  uStack_7e0 = (ulong)uVar2;
  local_7f8 = CONCAT26(sVar104,CONCAT24(sVar95,CONCAT22(sVar89,sVar78)));
  uVar8 = CONCAT24(sVar123,CONCAT22(sVar119,sVar110));
  uStack_7f0 = (ulong)uVar8;
  auVar62._8_7_ = uVar2;
  auVar62._0_8_ = local_7e8;
  auVar62[0xf] = 0;
  auVar61._8_6_ = uVar8;
  auVar61._0_8_ = local_7f8;
  auVar61._14_2_ = 0;
  local_c58 = pmaddwd(auVar62,auVar61);
  local_c48 = local_eb8;
  lStack_c40 = uStack_eb0;
  iVar81 = local_b98._0_4_ + local_bf8._0_4_ + local_c58._0_4_;
  iVar97 = local_b98._4_4_ + local_bf8._4_4_ + local_c58._4_4_;
  iVar112 = local_b98._8_4_ + local_bf8._8_4_ + local_c58._8_4_;
  iVar125 = local_b98._12_4_ + local_bf8._12_4_ + local_c58._12_4_;
  local_eb8 = CONCAT44(iVar97,iVar81);
  uStack_eb0 = CONCAT44(iVar125,iVar112);
  local_808 = CONCAT17(0,CONCAT16(local_a48._3_1_,
                                  (uint6)CONCAT14(local_a48._2_1_,
                                                  (uint)CONCAT12(local_a48._1_1_,
                                                                 (ushort)(byte)local_a48))));
  uVar2 = CONCAT16(local_a48._7_1_,
                   (uint6)CONCAT14(local_a48._6_1_,
                                   (uint)CONCAT12(local_a48._5_1_,(ushort)local_a48._4_1_)));
  uStack_800 = (ulong)uVar2;
  local_818 = CONCAT26(sVar105,CONCAT24(sVar96,CONCAT22(sVar90,sVar79)));
  uVar8 = CONCAT24(sVar124,CONCAT22(sVar120,sVar111));
  uStack_810 = (ulong)uVar8;
  auVar60._8_7_ = uVar2;
  auVar60._0_8_ = local_808;
  auVar60[0xf] = 0;
  auVar59._8_6_ = uVar8;
  auVar59._0_8_ = local_818;
  auVar59._14_2_ = 0;
  local_c78 = pmaddwd(auVar60,auVar59);
  local_c68 = local_ed8;
  lStack_c60 = uStack_ed0;
  iVar82 = local_bb8._0_4_ + local_c18._0_4_ + local_c78._0_4_;
  iVar98 = local_bb8._4_4_ + local_c18._4_4_ + local_c78._4_4_;
  iVar113 = local_bb8._8_4_ + local_c18._8_4_ + local_c78._8_4_;
  iVar126 = local_bb8._12_4_ + local_c18._12_4_ + local_c78._12_4_;
  local_ed8 = CONCAT44(iVar98,iVar82);
  uStack_ed0 = CONCAT44(iVar126,iVar113);
  local_828 = CONCAT17(0,CONCAT16(local_a68._3_1_,
                                  (uint6)CONCAT14(local_a68._2_1_,
                                                  (uint)CONCAT12(local_a68._1_1_,
                                                                 (ushort)(byte)local_a68))));
  uVar2 = CONCAT16(local_a68._7_1_,
                   (uint6)CONCAT14(local_a68._6_1_,
                                   (uint)CONCAT12(local_a68._5_1_,(ushort)local_a68._4_1_)));
  uStack_820 = (ulong)uVar2;
  local_838 = CONCAT26(sVar105,CONCAT24(sVar96,CONCAT22(sVar90,sVar79)));
  uVar8 = CONCAT24(sVar124,CONCAT22(sVar120,sVar111));
  uStack_830 = (ulong)uVar8;
  auVar58._8_7_ = uVar2;
  auVar58._0_8_ = local_828;
  auVar58[0xf] = 0;
  auVar57._8_6_ = uVar8;
  auVar57._0_8_ = local_838;
  auVar57._14_2_ = 0;
  local_c98 = pmaddwd(auVar58,auVar57);
  local_c88 = local_ec8;
  lStack_c80 = uStack_ec0;
  iVar83 = local_bd8._0_4_ + local_c38._0_4_ + local_c98._0_4_;
  iVar99 = local_bd8._4_4_ + local_c38._4_4_ + local_c98._4_4_;
  iVar114 = local_bd8._8_4_ + local_c38._8_4_ + local_c98._8_4_;
  iVar127 = local_bd8._12_4_ + local_c38._12_4_ + local_c98._12_4_;
  local_ec8 = CONCAT44(iVar99,iVar83);
  uStack_ec0 = CONCAT44(iVar127,iVar114);
  local_370 = (undefined8 *)((long)local_330 + (long)in_ESI);
  local_390 = (undefined8 *)((long)local_350 + (long)in_ECX);
  local_710 = 4;
  local_6a = 4;
  local_6c = 4;
  local_6e = 4;
  local_70 = 4;
  local_72 = 4;
  local_74 = 4;
  local_76 = 4;
  local_78 = 4;
  local_5a8 = 0x4000400040004;
  uStack_5a0 = 0x4000400040004;
  local_388 = *local_370;
  uStack_380 = 0;
  local_3a8 = *local_390;
  uStack_3a0 = 0;
  uStack_a80 = 0;
  local_a98 = 0;
  uStack_a90 = 0;
  local_a88._0_1_ = (byte)local_388;
  local_a88._1_1_ = (byte)((ulong)local_388 >> 8);
  local_a88._2_1_ = (byte)((ulong)local_388 >> 0x10);
  local_a88._3_1_ = (byte)((ulong)local_388 >> 0x18);
  local_a88._4_1_ = (byte)((ulong)local_388 >> 0x20);
  local_a88._5_1_ = (byte)((ulong)local_388 >> 0x28);
  local_a88._6_1_ = (byte)((ulong)local_388 >> 0x30);
  local_a88._7_1_ = (undefined1)((ulong)local_388 >> 0x38);
  uStack_aa0 = 0;
  local_ab8 = 0;
  uStack_ab0 = 0;
  local_aa8._0_1_ = (byte)local_3a8;
  local_aa8._1_1_ = (byte)((ulong)local_3a8 >> 8);
  local_aa8._2_1_ = (byte)((ulong)local_3a8 >> 0x10);
  local_aa8._3_1_ = (byte)((ulong)local_3a8 >> 0x18);
  local_aa8._4_1_ = (byte)((ulong)local_3a8 >> 0x20);
  local_aa8._5_1_ = (byte)((ulong)local_3a8 >> 0x28);
  local_aa8._6_1_ = (byte)((ulong)local_3a8 >> 0x30);
  local_aa8._7_1_ = (undefined1)((ulong)local_3a8 >> 0x38);
  uVar19 = CONCAT16(local_a88._3_1_,
                    (uint6)CONCAT14(local_a88._2_1_,
                                    (uint)CONCAT12(local_a88._1_1_,(ushort)(byte)local_a88)));
  uVar20 = CONCAT16(local_a88._7_1_,
                    (uint6)CONCAT14(local_a88._6_1_,
                                    (uint)CONCAT12(local_a88._5_1_,(ushort)local_a88._4_1_)));
  local_5c8 = 0x10000c00080004;
  uStack_5c0 = 0x40008000c;
  local_5b8._2_2_ = (ushort)local_a88._1_1_;
  local_5b8._4_2_ = (ushort)local_a88._2_1_;
  local_5b8._6_2_ = (ushort)local_a88._3_1_;
  uStack_5b0._2_2_ = (ushort)local_a88._5_1_;
  uStack_5b0._4_2_ = (ushort)local_a88._6_1_;
  sVar76 = (ushort)(byte)local_a88 * 4;
  sVar78 = local_5b8._2_2_ * 8;
  sVar88 = local_5b8._4_2_ * 0xc;
  sVar90 = local_5b8._6_2_ * 0x10;
  sVar95 = (ushort)local_a88._4_1_ * 0xc;
  sVar103 = uStack_5b0._2_2_ * 8;
  sVar105 = uStack_5b0._4_2_ * 4;
  uVar17 = CONCAT16(local_aa8._3_1_,
                    (uint6)CONCAT14(local_aa8._2_1_,
                                    (uint)CONCAT12(local_aa8._1_1_,(ushort)(byte)local_aa8)));
  uVar18 = CONCAT16(local_aa8._7_1_,
                    (uint6)CONCAT14(local_aa8._6_1_,
                                    (uint)CONCAT12(local_aa8._5_1_,(ushort)local_aa8._4_1_)));
  local_5e8 = 0x10000c00080004;
  uStack_5e0 = 0x40008000c;
  local_5d8._2_2_ = (ushort)local_aa8._1_1_;
  local_5d8._4_2_ = (ushort)local_aa8._2_1_;
  local_5d8._6_2_ = (ushort)local_aa8._3_1_;
  uStack_5d0._2_2_ = (ushort)local_aa8._5_1_;
  uStack_5d0._4_2_ = (ushort)local_aa8._6_1_;
  sVar77 = (ushort)(byte)local_aa8 * 4;
  sVar79 = local_5d8._2_2_ * 8;
  sVar89 = local_5d8._4_2_ * 0xc;
  sVar93 = local_5d8._6_2_ * 0x10;
  sVar96 = (ushort)local_aa8._4_1_ * 0xc;
  sVar104 = uStack_5d0._2_2_ * 8;
  sVar108 = uStack_5d0._4_2_ * 4;
  local_1c8 = CONCAT26(sVar90,CONCAT24(sVar88,CONCAT22(sVar78,sVar76)));
  uStack_1c0 = (ulong)CONCAT24(sVar105,CONCAT22(sVar103,sVar95));
  local_1b8 = local_e98;
  uStack_1b0 = uStack_e90;
  sVar80 = sVar80 + sVar76;
  sVar87 = sVar87 + sVar78;
  sVar91 = sVar91 + sVar88;
  sVar100 = sVar100 + sVar90;
  sVar102 = sVar102 + sVar95;
  sVar106 = sVar106 + sVar103;
  sVar115 = sVar115 + sVar105;
  local_e98._0_4_ = CONCAT22(sVar87,sVar80);
  local_e98._0_6_ = CONCAT24(sVar91,(undefined4)local_e98);
  local_e98 = CONCAT26(sVar100,(undefined6)local_e98);
  uStack_e90._0_4_ = CONCAT22(sVar106,sVar102);
  uStack_e90._0_6_ = CONCAT24(sVar115,(undefined4)uStack_e90);
  uStack_e90 = (ulong)(uint6)uStack_e90;
  local_1e8 = CONCAT26(sVar93,CONCAT24(sVar89,CONCAT22(sVar79,sVar77)));
  uStack_1e0 = (ulong)CONCAT24(sVar108,CONCAT22(sVar104,sVar96));
  local_1d8 = local_ea8;
  uStack_1d0 = uStack_ea0;
  sVar85 = sVar85 + sVar77;
  sVar86 = sVar86 + sVar79;
  sVar92 = sVar92 + sVar89;
  sVar94 = sVar94 + sVar93;
  sVar101 = sVar101 + sVar96;
  sVar107 = sVar107 + sVar104;
  sVar109 = sVar109 + sVar108;
  local_ea8._0_4_ = CONCAT22(sVar86,sVar85);
  local_ea8._0_6_ = CONCAT24(sVar92,(undefined4)local_ea8);
  local_ea8 = CONCAT26(sVar94,(undefined6)local_ea8);
  uStack_ea0._0_4_ = CONCAT22(sVar107,sVar101);
  uStack_ea0._0_6_ = CONCAT24(sVar109,(undefined4)uStack_ea0);
  uStack_ea0 = (ulong)(uint6)uStack_ea0;
  local_848 = CONCAT17(0,CONCAT16(local_a88._3_1_,
                                  (uint6)CONCAT14(local_a88._2_1_,
                                                  (uint)CONCAT12(local_a88._1_1_,
                                                                 (ushort)(byte)local_a88))));
  uVar2 = CONCAT16(local_a88._7_1_,
                   (uint6)CONCAT14(local_a88._6_1_,
                                   (uint)CONCAT12(local_a88._5_1_,(ushort)local_a88._4_1_)));
  uStack_840 = (ulong)uVar2;
  local_858 = CONCAT26(sVar90,CONCAT24(sVar88,CONCAT22(sVar78,sVar76)));
  uVar8 = CONCAT24(sVar105,CONCAT22(sVar103,sVar95));
  uStack_850 = (ulong)uVar8;
  auVar56._8_7_ = uVar2;
  auVar56._0_8_ = local_848;
  auVar56[0xf] = 0;
  auVar55._8_6_ = uVar8;
  auVar55._0_8_ = local_858;
  auVar55._14_2_ = 0;
  local_cb8 = pmaddwd(auVar56,auVar55);
  local_ca8 = local_eb8;
  lStack_ca0 = uStack_eb0;
  iVar81 = iVar81 + local_cb8._0_4_;
  iVar97 = iVar97 + local_cb8._4_4_;
  iVar112 = iVar112 + local_cb8._8_4_;
  iVar125 = iVar125 + local_cb8._12_4_;
  local_eb8 = CONCAT44(iVar97,iVar81);
  uStack_eb0 = CONCAT44(iVar125,iVar112);
  local_868 = CONCAT17(0,CONCAT16(local_a88._3_1_,
                                  (uint6)CONCAT14(local_a88._2_1_,
                                                  (uint)CONCAT12(local_a88._1_1_,
                                                                 (ushort)(byte)local_a88))));
  uVar2 = CONCAT16(local_a88._7_1_,
                   (uint6)CONCAT14(local_a88._6_1_,
                                   (uint)CONCAT12(local_a88._5_1_,(ushort)local_a88._4_1_)));
  uStack_860 = (ulong)uVar2;
  local_878 = CONCAT26(sVar93,CONCAT24(sVar89,CONCAT22(sVar79,sVar77)));
  uVar8 = CONCAT24(sVar108,CONCAT22(sVar104,sVar96));
  uStack_870 = (ulong)uVar8;
  auVar54._8_7_ = uVar2;
  auVar54._0_8_ = local_868;
  auVar54[0xf] = 0;
  auVar53._8_6_ = uVar8;
  auVar53._0_8_ = local_878;
  auVar53._14_2_ = 0;
  local_cd8 = pmaddwd(auVar54,auVar53);
  local_cc8 = local_ed8;
  lStack_cc0 = uStack_ed0;
  iVar82 = iVar82 + local_cd8._0_4_;
  iVar98 = iVar98 + local_cd8._4_4_;
  iVar113 = iVar113 + local_cd8._8_4_;
  iVar126 = iVar126 + local_cd8._12_4_;
  local_ed8 = CONCAT44(iVar98,iVar82);
  uStack_ed0 = CONCAT44(iVar126,iVar113);
  local_888 = CONCAT17(0,CONCAT16(local_aa8._3_1_,
                                  (uint6)CONCAT14(local_aa8._2_1_,
                                                  (uint)CONCAT12(local_aa8._1_1_,
                                                                 (ushort)(byte)local_aa8))));
  uVar2 = CONCAT16(local_aa8._7_1_,
                   (uint6)CONCAT14(local_aa8._6_1_,
                                   (uint)CONCAT12(local_aa8._5_1_,(ushort)local_aa8._4_1_)));
  uStack_880 = (ulong)uVar2;
  local_898 = CONCAT26(sVar93,CONCAT24(sVar89,CONCAT22(sVar79,sVar77)));
  uVar8 = CONCAT24(sVar108,CONCAT22(sVar104,sVar96));
  uStack_890 = (ulong)uVar8;
  auVar52._8_7_ = uVar2;
  auVar52._0_8_ = local_888;
  auVar52[0xf] = 0;
  auVar51._8_6_ = uVar8;
  auVar51._0_8_ = local_898;
  auVar51._14_2_ = 0;
  local_cf8 = pmaddwd(auVar52,auVar51);
  local_ce8 = local_ec8;
  lStack_ce0 = uStack_ec0;
  iVar83 = iVar83 + local_cf8._0_4_;
  iVar99 = iVar99 + local_cf8._4_4_;
  iVar114 = iVar114 + local_cf8._8_4_;
  iVar127 = iVar127 + local_cf8._12_4_;
  local_ec8 = CONCAT44(iVar99,iVar83);
  uStack_ec0 = CONCAT44(iVar127,iVar114);
  local_3b0 = (undefined8 *)((long)local_370 + (long)in_ESI);
  local_3d0 = (undefined8 *)((long)local_390 + (long)in_ECX);
  local_712 = 3;
  local_4a = 3;
  local_4c = 3;
  local_4e = 3;
  local_50 = 3;
  local_52 = 3;
  local_54 = 3;
  local_56 = 3;
  local_58 = 3;
  local_608 = 0x3000300030003;
  uStack_600 = 0x3000300030003;
  local_3c8 = *local_3b0;
  uStack_3c0 = 0;
  local_3e8 = *local_3d0;
  uStack_3e0 = 0;
  uStack_ac0 = 0;
  local_ad8 = 0;
  uStack_ad0 = 0;
  local_ac8._0_1_ = (byte)local_3c8;
  local_ac8._1_1_ = (byte)((ulong)local_3c8 >> 8);
  local_ac8._2_1_ = (byte)((ulong)local_3c8 >> 0x10);
  local_ac8._3_1_ = (byte)((ulong)local_3c8 >> 0x18);
  local_ac8._4_1_ = (byte)((ulong)local_3c8 >> 0x20);
  local_ac8._5_1_ = (byte)((ulong)local_3c8 >> 0x28);
  local_ac8._6_1_ = (byte)((ulong)local_3c8 >> 0x30);
  local_ac8._7_1_ = (undefined1)((ulong)local_3c8 >> 0x38);
  uStack_ae0 = 0;
  local_af8 = 0;
  uStack_af0 = 0;
  local_ae8._0_1_ = (byte)local_3e8;
  local_ae8._1_1_ = (byte)((ulong)local_3e8 >> 8);
  local_ae8._2_1_ = (byte)((ulong)local_3e8 >> 0x10);
  local_ae8._3_1_ = (byte)((ulong)local_3e8 >> 0x18);
  local_ae8._4_1_ = (byte)((ulong)local_3e8 >> 0x20);
  local_ae8._5_1_ = (byte)((ulong)local_3e8 >> 0x28);
  local_ae8._6_1_ = (byte)((ulong)local_3e8 >> 0x30);
  local_ae8._7_1_ = (undefined1)((ulong)local_3e8 >> 0x38);
  uVar15 = CONCAT16(local_ac8._3_1_,
                    (uint6)CONCAT14(local_ac8._2_1_,
                                    (uint)CONCAT12(local_ac8._1_1_,(ushort)(byte)local_ac8)));
  uVar16 = CONCAT16(local_ac8._7_1_,
                    (uint6)CONCAT14(local_ac8._6_1_,
                                    (uint)CONCAT12(local_ac8._5_1_,(ushort)local_ac8._4_1_)));
  local_628 = 0xc000900060003;
  uStack_620 = 0x300060009;
  local_618._2_2_ = (ushort)local_ac8._1_1_;
  local_618._4_2_ = (ushort)local_ac8._2_1_;
  local_618._6_2_ = (ushort)local_ac8._3_1_;
  uStack_610._2_2_ = (ushort)local_ac8._5_1_;
  uStack_610._4_2_ = (ushort)local_ac8._6_1_;
  sVar76 = (ushort)(byte)local_ac8 * 3;
  sVar78 = local_618._2_2_ * 6;
  sVar88 = local_618._4_2_ * 9;
  sVar90 = local_618._6_2_ * 0xc;
  sVar95 = (ushort)local_ac8._4_1_ * 9;
  sVar103 = uStack_610._2_2_ * 6;
  sVar105 = uStack_610._4_2_ * 3;
  uVar13 = CONCAT16(local_ae8._3_1_,
                    (uint6)CONCAT14(local_ae8._2_1_,
                                    (uint)CONCAT12(local_ae8._1_1_,(ushort)(byte)local_ae8)));
  uVar14 = CONCAT16(local_ae8._7_1_,
                    (uint6)CONCAT14(local_ae8._6_1_,
                                    (uint)CONCAT12(local_ae8._5_1_,(ushort)local_ae8._4_1_)));
  local_648 = 0xc000900060003;
  uStack_640 = 0x300060009;
  local_638._2_2_ = (ushort)local_ae8._1_1_;
  local_638._4_2_ = (ushort)local_ae8._2_1_;
  local_638._6_2_ = (ushort)local_ae8._3_1_;
  uStack_630._2_2_ = (ushort)local_ae8._5_1_;
  uStack_630._4_2_ = (ushort)local_ae8._6_1_;
  sVar77 = (ushort)(byte)local_ae8 * 3;
  sVar79 = local_638._2_2_ * 6;
  sVar89 = local_638._4_2_ * 9;
  sVar93 = local_638._6_2_ * 0xc;
  sVar96 = (ushort)local_ae8._4_1_ * 9;
  sVar104 = uStack_630._2_2_ * 6;
  sVar108 = uStack_630._4_2_ * 3;
  local_208 = CONCAT26(sVar90,CONCAT24(sVar88,CONCAT22(sVar78,sVar76)));
  uStack_200 = (ulong)CONCAT24(sVar105,CONCAT22(sVar103,sVar95));
  local_1f8 = local_e98;
  uStack_1f0 = uStack_e90;
  sVar80 = sVar80 + sVar76;
  sVar87 = sVar87 + sVar78;
  sVar91 = sVar91 + sVar88;
  sVar100 = sVar100 + sVar90;
  sVar102 = sVar102 + sVar95;
  sVar106 = sVar106 + sVar103;
  sVar115 = sVar115 + sVar105;
  local_e98._0_4_ = CONCAT22(sVar87,sVar80);
  local_e98._0_6_ = CONCAT24(sVar91,(undefined4)local_e98);
  local_e98 = CONCAT26(sVar100,(undefined6)local_e98);
  uStack_e90._0_4_ = CONCAT22(sVar106,sVar102);
  uStack_e90._0_6_ = CONCAT24(sVar115,(undefined4)uStack_e90);
  uStack_e90 = (ulong)(uint6)uStack_e90;
  local_228 = CONCAT26(sVar93,CONCAT24(sVar89,CONCAT22(sVar79,sVar77)));
  uStack_220 = (ulong)CONCAT24(sVar108,CONCAT22(sVar104,sVar96));
  local_218 = local_ea8;
  uStack_210 = uStack_ea0;
  sVar85 = sVar85 + sVar77;
  sVar86 = sVar86 + sVar79;
  sVar92 = sVar92 + sVar89;
  sVar94 = sVar94 + sVar93;
  sVar101 = sVar101 + sVar96;
  sVar107 = sVar107 + sVar104;
  sVar109 = sVar109 + sVar108;
  local_ea8._0_4_ = CONCAT22(sVar86,sVar85);
  local_ea8._0_6_ = CONCAT24(sVar92,(undefined4)local_ea8);
  local_ea8 = CONCAT26(sVar94,(undefined6)local_ea8);
  uStack_ea0._0_4_ = CONCAT22(sVar107,sVar101);
  uStack_ea0._0_6_ = CONCAT24(sVar109,(undefined4)uStack_ea0);
  uStack_ea0 = (ulong)(uint6)uStack_ea0;
  local_8a8 = CONCAT17(0,CONCAT16(local_ac8._3_1_,
                                  (uint6)CONCAT14(local_ac8._2_1_,
                                                  (uint)CONCAT12(local_ac8._1_1_,
                                                                 (ushort)(byte)local_ac8))));
  uVar2 = CONCAT16(local_ac8._7_1_,
                   (uint6)CONCAT14(local_ac8._6_1_,
                                   (uint)CONCAT12(local_ac8._5_1_,(ushort)local_ac8._4_1_)));
  uStack_8a0 = (ulong)uVar2;
  local_8b8 = CONCAT26(sVar90,CONCAT24(sVar88,CONCAT22(sVar78,sVar76)));
  uVar8 = CONCAT24(sVar105,CONCAT22(sVar103,sVar95));
  uStack_8b0 = (ulong)uVar8;
  auVar50._8_7_ = uVar2;
  auVar50._0_8_ = local_8a8;
  auVar50[0xf] = 0;
  auVar49._8_6_ = uVar8;
  auVar49._0_8_ = local_8b8;
  auVar49._14_2_ = 0;
  local_d18 = pmaddwd(auVar50,auVar49);
  local_d08 = local_eb8;
  lStack_d00 = uStack_eb0;
  iVar81 = iVar81 + local_d18._0_4_;
  iVar97 = iVar97 + local_d18._4_4_;
  iVar112 = iVar112 + local_d18._8_4_;
  iVar125 = iVar125 + local_d18._12_4_;
  local_eb8 = CONCAT44(iVar97,iVar81);
  uStack_eb0 = CONCAT44(iVar125,iVar112);
  local_8c8 = CONCAT17(0,CONCAT16(local_ac8._3_1_,
                                  (uint6)CONCAT14(local_ac8._2_1_,
                                                  (uint)CONCAT12(local_ac8._1_1_,
                                                                 (ushort)(byte)local_ac8))));
  uVar2 = CONCAT16(local_ac8._7_1_,
                   (uint6)CONCAT14(local_ac8._6_1_,
                                   (uint)CONCAT12(local_ac8._5_1_,(ushort)local_ac8._4_1_)));
  uStack_8c0 = (ulong)uVar2;
  local_8d8 = CONCAT26(sVar93,CONCAT24(sVar89,CONCAT22(sVar79,sVar77)));
  uVar8 = CONCAT24(sVar108,CONCAT22(sVar104,sVar96));
  uStack_8d0 = (ulong)uVar8;
  auVar48._8_7_ = uVar2;
  auVar48._0_8_ = local_8c8;
  auVar48[0xf] = 0;
  auVar47._8_6_ = uVar8;
  auVar47._0_8_ = local_8d8;
  auVar47._14_2_ = 0;
  local_d38 = pmaddwd(auVar48,auVar47);
  local_d28 = local_ed8;
  lStack_d20 = uStack_ed0;
  iVar82 = iVar82 + local_d38._0_4_;
  iVar98 = iVar98 + local_d38._4_4_;
  iVar113 = iVar113 + local_d38._8_4_;
  iVar126 = iVar126 + local_d38._12_4_;
  local_ed8 = CONCAT44(iVar98,iVar82);
  uStack_ed0 = CONCAT44(iVar126,iVar113);
  local_8e8 = CONCAT17(0,CONCAT16(local_ae8._3_1_,
                                  (uint6)CONCAT14(local_ae8._2_1_,
                                                  (uint)CONCAT12(local_ae8._1_1_,
                                                                 (ushort)(byte)local_ae8))));
  uVar2 = CONCAT16(local_ae8._7_1_,
                   (uint6)CONCAT14(local_ae8._6_1_,
                                   (uint)CONCAT12(local_ae8._5_1_,(ushort)local_ae8._4_1_)));
  uStack_8e0 = (ulong)uVar2;
  local_8f8 = CONCAT26(sVar93,CONCAT24(sVar89,CONCAT22(sVar79,sVar77)));
  uVar8 = CONCAT24(sVar108,CONCAT22(sVar104,sVar96));
  uStack_8f0 = (ulong)uVar8;
  auVar46._8_7_ = uVar2;
  auVar46._0_8_ = local_8e8;
  auVar46[0xf] = 0;
  auVar45._8_6_ = uVar8;
  auVar45._0_8_ = local_8f8;
  auVar45._14_2_ = 0;
  local_d58 = pmaddwd(auVar46,auVar45);
  local_d48 = local_ec8;
  lStack_d40 = uStack_ec0;
  iVar83 = iVar83 + local_d58._0_4_;
  iVar99 = iVar99 + local_d58._4_4_;
  iVar114 = iVar114 + local_d58._8_4_;
  iVar127 = iVar127 + local_d58._12_4_;
  local_ec8 = CONCAT44(iVar99,iVar83);
  uStack_ec0 = CONCAT44(iVar127,iVar114);
  local_3f0 = (undefined8 *)((long)local_3b0 + (long)in_ESI);
  local_410 = (undefined8 *)((long)local_3d0 + (long)in_ECX);
  local_714 = 2;
  local_2a = 2;
  local_2c = 2;
  local_2e = 2;
  local_30 = 2;
  local_32 = 2;
  local_34 = 2;
  local_36 = 2;
  local_38 = 2;
  local_668 = 0x2000200020002;
  uStack_660 = 0x2000200020002;
  local_408 = *local_3f0;
  uStack_400 = 0;
  local_428 = *local_410;
  uStack_420 = 0;
  uStack_b00 = 0;
  local_b18 = 0;
  uStack_b10 = 0;
  local_b08._0_1_ = (byte)local_408;
  local_b08._1_1_ = (byte)((ulong)local_408 >> 8);
  local_b08._2_1_ = (byte)((ulong)local_408 >> 0x10);
  local_b08._3_1_ = (byte)((ulong)local_408 >> 0x18);
  local_b08._4_1_ = (byte)((ulong)local_408 >> 0x20);
  local_b08._5_1_ = (byte)((ulong)local_408 >> 0x28);
  local_b08._6_1_ = (byte)((ulong)local_408 >> 0x30);
  local_b08._7_1_ = (undefined1)((ulong)local_408 >> 0x38);
  uStack_b20 = 0;
  local_b38 = 0;
  uStack_b30 = 0;
  local_b28._0_1_ = (byte)local_428;
  local_b28._1_1_ = (byte)((ulong)local_428 >> 8);
  local_b28._2_1_ = (byte)((ulong)local_428 >> 0x10);
  local_b28._3_1_ = (byte)((ulong)local_428 >> 0x18);
  local_b28._4_1_ = (byte)((ulong)local_428 >> 0x20);
  local_b28._5_1_ = (byte)((ulong)local_428 >> 0x28);
  local_b28._6_1_ = (byte)((ulong)local_428 >> 0x30);
  local_b28._7_1_ = (undefined1)((ulong)local_428 >> 0x38);
  uVar11 = CONCAT16(local_b08._3_1_,
                    (uint6)CONCAT14(local_b08._2_1_,
                                    (uint)CONCAT12(local_b08._1_1_,(ushort)(byte)local_b08)));
  uVar12 = CONCAT16(local_b08._7_1_,
                    (uint6)CONCAT14(local_b08._6_1_,
                                    (uint)CONCAT12(local_b08._5_1_,(ushort)local_b08._4_1_)));
  local_688 = 0x8000600040002;
  uStack_680 = 0x200040006;
  local_678._2_2_ = (ushort)local_b08._1_1_;
  local_678._4_2_ = (ushort)local_b08._2_1_;
  local_678._6_2_ = (ushort)local_b08._3_1_;
  uStack_670._2_2_ = (ushort)local_b08._5_1_;
  uStack_670._4_2_ = (ushort)local_b08._6_1_;
  sVar76 = (ushort)(byte)local_b08 * 2;
  sVar78 = local_678._2_2_ * 4;
  sVar88 = local_678._4_2_ * 6;
  sVar90 = local_678._6_2_ * 8;
  sVar95 = (ushort)local_b08._4_1_ * 6;
  sVar103 = uStack_670._2_2_ * 4;
  sVar105 = uStack_670._4_2_ * 2;
  uVar9 = CONCAT16(local_b28._3_1_,
                   (uint6)CONCAT14(local_b28._2_1_,
                                   (uint)CONCAT12(local_b28._1_1_,(ushort)(byte)local_b28)));
  uVar10 = CONCAT16(local_b28._7_1_,
                    (uint6)CONCAT14(local_b28._6_1_,
                                    (uint)CONCAT12(local_b28._5_1_,(ushort)local_b28._4_1_)));
  local_6a8 = 0x8000600040002;
  uStack_6a0 = 0x200040006;
  local_698._2_2_ = (ushort)local_b28._1_1_;
  local_698._4_2_ = (ushort)local_b28._2_1_;
  local_698._6_2_ = (ushort)local_b28._3_1_;
  uStack_690._2_2_ = (ushort)local_b28._5_1_;
  uStack_690._4_2_ = (ushort)local_b28._6_1_;
  sVar77 = (ushort)(byte)local_b28 * 2;
  sVar79 = local_698._2_2_ * 4;
  sVar89 = local_698._4_2_ * 6;
  sVar93 = local_698._6_2_ * 8;
  sVar96 = (ushort)local_b28._4_1_ * 6;
  sVar104 = uStack_690._2_2_ * 4;
  sVar108 = uStack_690._4_2_ * 2;
  local_248 = CONCAT26(sVar90,CONCAT24(sVar88,CONCAT22(sVar78,sVar76)));
  uStack_240 = (ulong)CONCAT24(sVar105,CONCAT22(sVar103,sVar95));
  local_238 = local_e98;
  uStack_230 = uStack_e90;
  sVar80 = sVar80 + sVar76;
  sVar87 = sVar87 + sVar78;
  sVar91 = sVar91 + sVar88;
  sVar100 = sVar100 + sVar90;
  sVar102 = sVar102 + sVar95;
  sVar106 = sVar106 + sVar103;
  sVar115 = sVar115 + sVar105;
  local_e98._0_4_ = CONCAT22(sVar87,sVar80);
  local_e98._0_6_ = CONCAT24(sVar91,(undefined4)local_e98);
  local_e98 = CONCAT26(sVar100,(undefined6)local_e98);
  uStack_e90._0_4_ = CONCAT22(sVar106,sVar102);
  uStack_e90._0_6_ = CONCAT24(sVar115,(undefined4)uStack_e90);
  uStack_e90 = (ulong)(uint6)uStack_e90;
  local_268 = CONCAT26(sVar93,CONCAT24(sVar89,CONCAT22(sVar79,sVar77)));
  uStack_260 = (ulong)CONCAT24(sVar108,CONCAT22(sVar104,sVar96));
  local_258 = local_ea8;
  uStack_250 = uStack_ea0;
  sVar85 = sVar85 + sVar77;
  sVar86 = sVar86 + sVar79;
  sVar92 = sVar92 + sVar89;
  sVar94 = sVar94 + sVar93;
  sVar101 = sVar101 + sVar96;
  sVar107 = sVar107 + sVar104;
  sVar109 = sVar109 + sVar108;
  local_ea8._0_4_ = CONCAT22(sVar86,sVar85);
  local_ea8._0_6_ = CONCAT24(sVar92,(undefined4)local_ea8);
  local_ea8 = CONCAT26(sVar94,(undefined6)local_ea8);
  uStack_ea0._0_4_ = CONCAT22(sVar107,sVar101);
  uStack_ea0._0_6_ = CONCAT24(sVar109,(undefined4)uStack_ea0);
  uStack_ea0 = (ulong)(uint6)uStack_ea0;
  local_908 = CONCAT17(0,CONCAT16(local_b08._3_1_,
                                  (uint6)CONCAT14(local_b08._2_1_,
                                                  (uint)CONCAT12(local_b08._1_1_,
                                                                 (ushort)(byte)local_b08))));
  uVar2 = CONCAT16(local_b08._7_1_,
                   (uint6)CONCAT14(local_b08._6_1_,
                                   (uint)CONCAT12(local_b08._5_1_,(ushort)local_b08._4_1_)));
  uStack_900 = (ulong)uVar2;
  local_918 = CONCAT26(sVar90,CONCAT24(sVar88,CONCAT22(sVar78,sVar76)));
  uVar8 = CONCAT24(sVar105,CONCAT22(sVar103,sVar95));
  uStack_910 = (ulong)uVar8;
  auVar44._8_7_ = uVar2;
  auVar44._0_8_ = local_908;
  auVar44[0xf] = 0;
  auVar43._8_6_ = uVar8;
  auVar43._0_8_ = local_918;
  auVar43._14_2_ = 0;
  local_d78 = pmaddwd(auVar44,auVar43);
  local_d68 = local_eb8;
  lStack_d60 = uStack_eb0;
  iVar81 = iVar81 + local_d78._0_4_;
  iVar97 = iVar97 + local_d78._4_4_;
  iVar112 = iVar112 + local_d78._8_4_;
  iVar125 = iVar125 + local_d78._12_4_;
  local_eb8 = CONCAT44(iVar97,iVar81);
  uStack_eb0 = CONCAT44(iVar125,iVar112);
  local_928 = CONCAT17(0,CONCAT16(local_b08._3_1_,
                                  (uint6)CONCAT14(local_b08._2_1_,
                                                  (uint)CONCAT12(local_b08._1_1_,
                                                                 (ushort)(byte)local_b08))));
  uVar2 = CONCAT16(local_b08._7_1_,
                   (uint6)CONCAT14(local_b08._6_1_,
                                   (uint)CONCAT12(local_b08._5_1_,(ushort)local_b08._4_1_)));
  uStack_920 = (ulong)uVar2;
  local_938 = CONCAT26(sVar93,CONCAT24(sVar89,CONCAT22(sVar79,sVar77)));
  uVar8 = CONCAT24(sVar108,CONCAT22(sVar104,sVar96));
  uStack_930 = (ulong)uVar8;
  auVar42._8_7_ = uVar2;
  auVar42._0_8_ = local_928;
  auVar42[0xf] = 0;
  auVar41._8_6_ = uVar8;
  auVar41._0_8_ = local_938;
  auVar41._14_2_ = 0;
  local_d98 = pmaddwd(auVar42,auVar41);
  local_d88 = local_ed8;
  lStack_d80 = uStack_ed0;
  iVar82 = iVar82 + local_d98._0_4_;
  iVar98 = iVar98 + local_d98._4_4_;
  iVar113 = iVar113 + local_d98._8_4_;
  iVar126 = iVar126 + local_d98._12_4_;
  local_ed8 = CONCAT44(iVar98,iVar82);
  uStack_ed0 = CONCAT44(iVar126,iVar113);
  local_948 = CONCAT17(0,CONCAT16(local_b28._3_1_,
                                  (uint6)CONCAT14(local_b28._2_1_,
                                                  (uint)CONCAT12(local_b28._1_1_,
                                                                 (ushort)(byte)local_b28))));
  uVar2 = CONCAT16(local_b28._7_1_,
                   (uint6)CONCAT14(local_b28._6_1_,
                                   (uint)CONCAT12(local_b28._5_1_,(ushort)local_b28._4_1_)));
  uStack_940 = (ulong)uVar2;
  local_958 = CONCAT26(sVar93,CONCAT24(sVar89,CONCAT22(sVar79,sVar77)));
  uVar8 = CONCAT24(sVar108,CONCAT22(sVar104,sVar96));
  uStack_950 = (ulong)uVar8;
  auVar40._8_7_ = uVar2;
  auVar40._0_8_ = local_948;
  auVar40[0xf] = 0;
  auVar39._8_6_ = uVar8;
  auVar39._0_8_ = local_958;
  auVar39._14_2_ = 0;
  local_db8 = pmaddwd(auVar40,auVar39);
  local_da8 = local_ec8;
  lStack_da0 = uStack_ec0;
  iVar83 = iVar83 + local_db8._0_4_;
  iVar99 = iVar99 + local_db8._4_4_;
  iVar114 = iVar114 + local_db8._8_4_;
  iVar127 = iVar127 + local_db8._12_4_;
  local_ec8 = CONCAT44(iVar99,iVar83);
  uStack_ec0 = CONCAT44(iVar127,iVar114);
  local_430 = (undefined8 *)((long)local_3f0 + (long)in_ESI);
  local_450 = (undefined8 *)((long)local_410 + (long)in_ECX);
  local_716 = 1;
  local_2 = 1;
  local_4 = 1;
  local_6 = 1;
  local_8 = 1;
  local_a = 1;
  local_c = 1;
  local_e = 1;
  local_10 = 1;
  local_6c8 = 0x1000100010001;
  uStack_6c0 = 0x1000100010001;
  local_448 = *local_430;
  uStack_440 = 0;
  local_468 = *local_450;
  uStack_460 = 0;
  uStack_b40 = 0;
  local_b58 = 0;
  uStack_b50 = 0;
  local_b48._0_1_ = (byte)local_448;
  local_b48._1_1_ = (byte)((ulong)local_448 >> 8);
  local_b48._2_1_ = (byte)((ulong)local_448 >> 0x10);
  local_b48._3_1_ = (byte)((ulong)local_448 >> 0x18);
  local_b48._4_1_ = (byte)((ulong)local_448 >> 0x20);
  local_b48._5_1_ = (byte)((ulong)local_448 >> 0x28);
  local_b48._6_1_ = (byte)((ulong)local_448 >> 0x30);
  local_b48._7_1_ = (undefined1)((ulong)local_448 >> 0x38);
  uStack_b60 = 0;
  local_b78 = 0;
  uStack_b70 = 0;
  local_b68._0_1_ = (byte)local_468;
  local_b68._1_1_ = (byte)((ulong)local_468 >> 8);
  local_b68._2_1_ = (byte)((ulong)local_468 >> 0x10);
  local_b68._3_1_ = (byte)((ulong)local_468 >> 0x18);
  local_b68._4_1_ = (byte)((ulong)local_468 >> 0x20);
  local_b68._5_1_ = (byte)((ulong)local_468 >> 0x28);
  local_b68._6_1_ = (byte)((ulong)local_468 >> 0x30);
  local_b68._7_1_ = (undefined1)((ulong)local_468 >> 0x38);
  uVar5 = (ushort)(byte)local_b48;
  uVar6 = CONCAT16(local_b48._3_1_,
                   (uint6)CONCAT14(local_b48._2_1_,(uint)CONCAT12(local_b48._1_1_,uVar5)));
  uVar7 = CONCAT16(local_b48._7_1_,
                   (uint6)CONCAT14(local_b48._6_1_,
                                   (uint)CONCAT12(local_b48._5_1_,(ushort)local_b48._4_1_)));
  local_6d8._2_2_ = (ushort)local_b48._1_1_;
  local_6d8._4_2_ = (ushort)local_b48._2_1_;
  local_6d8._6_2_ = (ushort)local_b48._3_1_;
  uStack_6d0._2_2_ = (ushort)local_b48._5_1_;
  uStack_6d0._4_2_ = (ushort)local_b48._6_1_;
  sVar76 = local_6d8._2_2_ * 2;
  sVar78 = local_6d8._4_2_ * 3;
  sVar88 = local_6d8._6_2_ * 4;
  sVar90 = (ushort)local_b48._4_1_ * 3;
  sVar95 = uStack_6d0._2_2_ * 2;
  uVar1 = (ushort)(byte)local_b68;
  uVar2 = CONCAT16(local_b68._3_1_,
                   (uint6)CONCAT14(local_b68._2_1_,(uint)CONCAT12(local_b68._1_1_,uVar1)));
  uVar3 = CONCAT16(local_b68._7_1_,
                   (uint6)CONCAT14(local_b68._6_1_,
                                   (uint)CONCAT12(local_b68._5_1_,(ushort)local_b68._4_1_)));
  local_6f8._2_2_ = (ushort)local_b68._1_1_;
  local_6f8._4_2_ = (ushort)local_b68._2_1_;
  local_6f8._6_2_ = (ushort)local_b68._3_1_;
  uStack_6f0._2_2_ = (ushort)local_b68._5_1_;
  uStack_6f0._4_2_ = (ushort)local_b68._6_1_;
  sVar77 = local_6f8._2_2_ * 2;
  sVar79 = local_6f8._4_2_ * 3;
  sVar89 = local_6f8._6_2_ * 4;
  sVar93 = (ushort)local_b68._4_1_ * 3;
  sVar96 = uStack_6f0._2_2_ * 2;
  local_288 = CONCAT26(sVar88,CONCAT24(sVar78,CONCAT22(sVar76,uVar5)));
  uStack_280 = (ulong)CONCAT14(local_b48._6_1_,CONCAT22(sVar95,sVar90));
  local_278 = local_e98;
  uStack_270 = uStack_e90;
  local_e98._0_4_ = CONCAT22(sVar87 + sVar76,sVar80 + uVar5);
  local_e98._0_6_ = CONCAT24(sVar91 + sVar78,(undefined4)local_e98);
  local_e98 = CONCAT26(sVar100 + sVar88,(undefined6)local_e98);
  uStack_e90._0_4_ = CONCAT22(sVar106 + sVar95,sVar102 + sVar90);
  uStack_e90._0_6_ = CONCAT24(sVar115 + uStack_6d0._4_2_,(undefined4)uStack_e90);
  uStack_e90 = (ulong)(uint6)uStack_e90;
  local_2a8 = CONCAT26(sVar89,CONCAT24(sVar79,CONCAT22(sVar77,uVar1)));
  uStack_2a0 = (ulong)CONCAT14(local_b68._6_1_,CONCAT22(sVar96,sVar93));
  local_298 = local_ea8;
  uStack_290 = uStack_ea0;
  local_ea8._0_4_ = CONCAT22(sVar86 + sVar77,sVar85 + uVar1);
  local_ea8._0_6_ = CONCAT24(sVar92 + sVar79,(undefined4)local_ea8);
  local_ea8 = CONCAT26(sVar94 + sVar89,(undefined6)local_ea8);
  uStack_ea0._0_4_ = CONCAT22(sVar107 + sVar96,sVar101 + sVar93);
  uStack_ea0._0_6_ = CONCAT24(sVar109 + uStack_6f0._4_2_,(undefined4)uStack_ea0);
  uStack_ea0 = (ulong)(uint6)uStack_ea0;
  local_968 = CONCAT17(0,CONCAT16(local_b48._3_1_,
                                  (uint6)CONCAT14(local_b48._2_1_,
                                                  (uint)CONCAT12(local_b48._1_1_,
                                                                 (ushort)(byte)local_b48))));
  uVar4 = CONCAT16(local_b48._7_1_,
                   (uint6)CONCAT14(local_b48._6_1_,
                                   (uint)CONCAT12(local_b48._5_1_,(ushort)local_b48._4_1_)));
  uStack_960 = (ulong)uVar4;
  local_978 = CONCAT26(sVar88,CONCAT24(sVar78,CONCAT22(sVar76,uVar5)));
  uVar75 = CONCAT14(local_b48._6_1_,CONCAT22(sVar95,sVar90));
  uStack_970 = (ulong)uVar75;
  auVar38._8_7_ = uVar4;
  auVar38._0_8_ = local_968;
  auVar38[0xf] = 0;
  auVar37._8_5_ = uVar75;
  auVar37._0_8_ = local_978;
  auVar37._13_3_ = 0;
  local_dd8 = pmaddwd(auVar38,auVar37);
  local_dc8 = local_eb8;
  lStack_dc0 = uStack_eb0;
  local_eb8 = CONCAT44(iVar97 + local_dd8._4_4_,iVar81 + local_dd8._0_4_);
  uStack_eb0 = CONCAT44(iVar125 + local_dd8._12_4_,iVar112 + local_dd8._8_4_);
  local_988 = CONCAT17(0,CONCAT16(local_b48._3_1_,
                                  (uint6)CONCAT14(local_b48._2_1_,
                                                  (uint)CONCAT12(local_b48._1_1_,
                                                                 (ushort)(byte)local_b48))));
  uVar4 = CONCAT16(local_b48._7_1_,
                   (uint6)CONCAT14(local_b48._6_1_,
                                   (uint)CONCAT12(local_b48._5_1_,(ushort)local_b48._4_1_)));
  uStack_980 = (ulong)uVar4;
  local_998 = CONCAT26(sVar89,CONCAT24(sVar79,CONCAT22(sVar77,uVar1)));
  uVar75 = CONCAT14(local_b68._6_1_,CONCAT22(sVar96,sVar93));
  uStack_990 = (ulong)uVar75;
  auVar36._8_7_ = uVar4;
  auVar36._0_8_ = local_988;
  auVar36[0xf] = 0;
  auVar35._8_5_ = uVar75;
  auVar35._0_8_ = local_998;
  auVar35._13_3_ = 0;
  local_df8 = pmaddwd(auVar36,auVar35);
  local_de8 = local_ed8;
  lStack_de0 = uStack_ed0;
  local_ed8 = CONCAT44(iVar98 + local_df8._4_4_,iVar82 + local_df8._0_4_);
  uStack_ed0 = CONCAT44(iVar126 + local_df8._12_4_,iVar113 + local_df8._8_4_);
  local_9a8 = CONCAT17(0,CONCAT16(local_b68._3_1_,
                                  (uint6)CONCAT14(local_b68._2_1_,
                                                  (uint)CONCAT12(local_b68._1_1_,
                                                                 (ushort)(byte)local_b68))));
  uVar4 = CONCAT16(local_b68._7_1_,
                   (uint6)CONCAT14(local_b68._6_1_,
                                   (uint)CONCAT12(local_b68._5_1_,(ushort)local_b68._4_1_)));
  uStack_9a0 = (ulong)uVar4;
  local_9b8 = CONCAT26(sVar89,CONCAT24(sVar79,CONCAT22(sVar77,uVar1)));
  uVar75 = CONCAT14(local_b68._6_1_,CONCAT22(sVar96,sVar93));
  uStack_9b0 = (ulong)uVar75;
  auVar34._8_7_ = uVar4;
  auVar34._0_8_ = local_9a8;
  auVar34[0xf] = 0;
  auVar33._8_5_ = uVar75;
  auVar33._0_8_ = local_9b8;
  auVar33._13_3_ = 0;
  local_e18 = pmaddwd(auVar34,auVar33);
  local_e08 = local_ec8;
  lStack_e00 = uStack_ec0;
  local_ec8 = CONCAT44(iVar99 + local_e18._4_4_,iVar83 + local_e18._0_4_);
  uStack_ec0 = CONCAT44(iVar127 + local_e18._12_4_,iVar114 + local_e18._8_4_);
  local_e40 = (long)local_430 + (long)in_ESI;
  local_e50 = (long)local_450 + (long)in_ECX;
  local_b68 = local_468;
  local_b48 = local_448;
  local_b28 = local_428;
  local_b08 = local_408;
  local_ae8 = local_3e8;
  local_ac8 = local_3c8;
  local_aa8 = local_3a8;
  local_a88 = local_388;
  local_a68 = local_368;
  local_a48 = local_348;
  local_a28 = local_328;
  local_a08 = local_308;
  local_9e8 = local_2e8;
  local_9c8 = local_2c8;
  local_6f8 = (ulong)uVar2;
  uStack_6f0 = (ulong)uVar3;
  local_6e8 = local_708;
  auStack_6e0 = auStack_700;
  local_6d8 = (ulong)uVar6;
  uStack_6d0 = (ulong)uVar7;
  local_6b8 = local_708;
  auStack_6b0 = auStack_700;
  local_698 = (ulong)uVar9;
  uStack_690 = (ulong)uVar10;
  local_678 = (ulong)uVar11;
  uStack_670 = (ulong)uVar12;
  local_658 = local_708;
  auStack_650 = auStack_700;
  local_638 = (ulong)uVar13;
  uStack_630 = (ulong)uVar14;
  local_618 = (ulong)uVar15;
  uStack_610 = (ulong)uVar16;
  local_5f8 = local_708;
  auStack_5f0 = auStack_700;
  local_5d8 = (ulong)uVar17;
  uStack_5d0 = (ulong)uVar18;
  local_5b8 = (ulong)uVar19;
  uStack_5b0 = (ulong)uVar20;
  local_598 = local_708;
  auStack_590 = auStack_700;
  local_578 = (ulong)uVar21;
  uStack_570 = (ulong)uVar22;
  local_558 = (ulong)uVar23;
  uStack_550 = (ulong)uVar24;
  local_538 = local_708;
  auStack_530 = auStack_700;
  local_518 = (ulong)uVar25;
  uStack_510 = (ulong)uVar26;
  local_4f8 = (ulong)uVar27;
  uStack_4f0 = (ulong)uVar28;
  local_4d8 = local_708;
  auStack_4d0 = auStack_700;
  local_4c8 = local_708;
  auStack_4c0 = auStack_700;
  local_4b8 = (ulong)uVar29;
  uStack_4b0 = (ulong)uVar30;
  local_4a8 = local_708;
  auStack_4a0 = auStack_700;
  local_498 = (ulong)uVar31;
  uStack_490 = (ulong)uVar32;
  local_478 = local_708;
  auStack_470 = auStack_700;
  local_e8 = local_488;
  uStack_e0 = uStack_480;
  local_c8 = local_4e8;
  uStack_c0 = uStack_4e0;
  local_a8 = local_548;
  uStack_a0 = uStack_540;
  local_88 = local_5a8;
  uStack_80 = uStack_5a0;
  local_68 = local_608;
  uStack_60 = uStack_600;
  local_48 = local_668;
  uStack_40 = uStack_660;
  local_28 = local_6c8;
  uStack_20 = uStack_6c0;
  local_e68 = HorizontalAdd16b_SSE2((__m128i *)&local_e98);
  local_e64 = HorizontalAdd16b_SSE2((__m128i *)&local_ea8);
  local_e60 = HorizontalAdd32b_SSE2((__m128i *)&local_eb8);
  local_e5c = HorizontalAdd32b_SSE2((__m128i *)&local_ed8);
  local_e58 = HorizontalAdd32b_SSE2((__m128i *)&local_ec8);
  dVar84 = VP8SSIMFromStats((VP8DistoStats *)0x19d2e4);
  return dVar84;
}

Assistant:

double SSIMGet_SSE2(const uint8_t* src1, int stride1,
                           const uint8_t* src2, int stride2) {
  VP8DistoStats stats;
  const __m128i zero = _mm_setzero_si128();
  __m128i xm = zero, ym = zero;                // 16b accums
  __m128i xxm = zero, yym = zero, xym = zero;  // 32b accum
  const __m128i Wx = _mm_loadu_si128((const __m128i*)kWeight);
  assert(2 * VP8_SSIM_KERNEL + 1 == 7);
  ACCUMULATE_ROW(1);
  ACCUMULATE_ROW(2);
  ACCUMULATE_ROW(3);
  ACCUMULATE_ROW(4);
  ACCUMULATE_ROW(3);
  ACCUMULATE_ROW(2);
  ACCUMULATE_ROW(1);
  stats.xm  = HorizontalAdd16b_SSE2(&xm);
  stats.ym  = HorizontalAdd16b_SSE2(&ym);
  stats.xxm = HorizontalAdd32b_SSE2(&xxm);
  stats.xym = HorizontalAdd32b_SSE2(&xym);
  stats.yym = HorizontalAdd32b_SSE2(&yym);
  return VP8SSIMFromStats(&stats);
}